

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unshuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  int *in_RDX;
  long in_RSI;
  void *in_RDI;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_20;
  
  __src = malloc(in_RSI << 1);
  local_38 = (undefined1 *)((long)in_RDI + in_RSI * 2);
  local_30 = (undefined1 *)((long)__src + in_RSI * 2 + -1);
  for (local_20 = 0; local_38 = local_38 + -1, local_20 < in_RSI; local_20 = local_20 + 1) {
    *local_30 = *local_38;
    local_30[-1] = local_38[-in_RSI];
    local_30 = local_30 + -2;
  }
  memcpy(in_RDI,__src,in_RSI << 1);
  free(__src);
  return *in_RDX;
}

Assistant:

static int fits_unshuffle_2bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 2-byte integers */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap + (2 * length) - 1;
    cptr = ptr + (2 * length) - 1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       heapptr--;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}